

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.c
# Opt level: O3

int compute_deltaq(AV1_COMP *cpi,int q,double rate_factor)

{
  CYCLIC_REFRESH *pCVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  pCVar1 = cpi->cyclic_refresh;
  iVar3 = av1_compute_qdelta_by_rate(cpi,(cpi->common).current_frame.frame_type,q,rate_factor);
  iVar4 = q * pCVar1->max_qdelta_perc;
  iVar2 = iVar4 / 100;
  if (SBORROW4(iVar2,-iVar3) != iVar2 + iVar3 < 0) {
    iVar3 = -iVar4 / 100;
  }
  return iVar3;
}

Assistant:

static int compute_deltaq(const AV1_COMP *cpi, int q, double rate_factor) {
  const CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
  int deltaq = av1_compute_qdelta_by_rate(
      cpi, cpi->common.current_frame.frame_type, q, rate_factor);
  if ((-deltaq) > cr->max_qdelta_perc * q / 100) {
    deltaq = -cr->max_qdelta_perc * q / 100;
  }
  return deltaq;
}